

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

sexp_conflict sexp_add_import_binding(sexp_conflict ctx,sexp_conflict env)

{
  sexp_conflict psVar1;
  sexp_conflict psVar2;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict sym;
  sexp_gc_var_t local_40;
  sexp_conflict local_30;
  sexp_gc_var_t local_28;
  sexp_conflict local_18;
  sexp_conflict local_10;
  sexp_conflict local_8;
  
  local_18 = (sexp_conflict)0x43e;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_28,0,0x10);
  local_30 = (sexp_conflict)0x43e;
  memset(&local_40,0,0x10);
  local_28.var = &local_18;
  local_28.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_28;
  local_40.var = &local_30;
  local_40.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_40;
  local_18 = (sexp_conflict)sexp_intern(local_8,"repl-import",0xffffffffffffffff);
  psVar1 = local_8;
  psVar2 = sexp_meta_env(local_8);
  local_30 = (sexp_conflict)sexp_env_ref(psVar1,psVar2,local_18,0x43e);
  local_18 = (sexp_conflict)sexp_intern(local_8,"import",0xffffffffffffffff);
  sexp_env_define(local_8,local_10,local_18,local_30);
  (local_8->value).context.saves = local_28.next;
  return local_10;
}

Assistant:

static sexp sexp_add_import_binding (sexp ctx, sexp env) {
  sexp_gc_var2(sym, tmp);
  sexp_gc_preserve2(ctx, sym, tmp);
  sym = sexp_intern(ctx, "repl-import", -1);
  tmp = sexp_env_ref(ctx, sexp_meta_env(ctx), sym, SEXP_VOID);
  sym = sexp_intern(ctx, "import", -1);
  sexp_env_define(ctx, env, sym, tmp);
  sexp_gc_release2(ctx);
  return env;
}